

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void av1_find_cnn_output_size
               (int in_width,int in_height,CNN_CONFIG *cnn_config,int *out_width,int *out_height,
               int *out_channels)

{
  int iVar1;
  long in_RCX;
  int *in_RDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  long in_R9;
  int output_num;
  int b_1;
  int b;
  int o_height;
  int o_width;
  int branch;
  CNN_BRANCH_CONFIG *branch_config;
  CNN_LAYER_CONFIG *layer_config;
  int i;
  int i_height [4];
  int i_width [4];
  int channels_per_branch [4];
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  CNN_BRANCH_CONFIG *local_70;
  CNN_LAYER_CONFIG *local_68;
  int local_5c;
  int local_58 [4];
  int local_48 [4];
  int local_38 [4];
  long local_28;
  long local_20;
  long local_18;
  int *local_10;
  int local_8;
  int local_4;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  memset(local_38,0,0x10);
  memset(local_48,0,0x10);
  memset(local_58,0,0x10);
  local_48[0] = local_4 + local_10[2] * 2;
  local_58[0] = local_8 + local_10[3] * 2;
  for (local_5c = 0; local_5c < *local_10; local_5c = local_5c + 1) {
    local_68 = (CNN_LAYER_CONFIG *)(local_10 + (long)local_5c * 0x1e + 6);
    local_70 = &local_68->branch_config;
    local_74 = local_68->branch;
    local_78 = 0;
    local_7c = 0;
    if (local_68->branch_copy_type == '\x01') {
      for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
        if (((local_70->input_to_branches & 1 << ((byte)local_80 & 0x1f)) != 0) &&
           (local_80 != local_74)) {
          local_48[local_80] = local_48[local_74];
          local_58[local_80] = local_58[local_74];
        }
      }
    }
    av1_find_cnn_layer_output_size
              (local_48[local_74],local_58[local_74],local_68,&local_78,&local_7c);
    local_48[local_74] = local_78;
    local_58[local_74] = local_7c;
    if (local_68->branch_copy_type == '\x02') {
      for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
        if (((local_70->input_to_branches & 1 << ((byte)local_84 & 0x1f)) != 0) &&
           (local_84 != local_74)) {
          local_48[local_84] = local_78;
          local_58[local_84] = local_7c;
        }
      }
    }
    find_cnn_out_channels(local_68,local_38);
    iVar1 = local_68->output_num;
    if (iVar1 != -1) {
      *(int *)(local_18 + (long)iVar1 * 4) = local_78;
      *(int *)(local_20 + (long)iVar1 * 4) = local_7c;
      *(int *)(local_28 + (long)iVar1 * 4) = local_38[local_68->branch];
    }
  }
  return;
}

Assistant:

void av1_find_cnn_output_size(int in_width, int in_height,
                              const CNN_CONFIG *cnn_config, int *out_width,
                              int *out_height, int *out_channels) {
  int channels_per_branch[CNN_MAX_BRANCHES] = { 0 };
  int i_width[CNN_MAX_BRANCHES] = { 0 };
  int i_height[CNN_MAX_BRANCHES] = { 0 };
  i_width[0] = in_width + cnn_config->ext_width * 2;
  i_height[0] = in_height + cnn_config->ext_height * 2;

#if CONFIG_DEBUG
  assert(cnn_has_at_least_one_output(cnn_config));
#endif

  for (int i = 0; i < cnn_config->num_layers; ++i) {
    const CNN_LAYER_CONFIG *layer_config = &cnn_config->layer_config[i];
    const CNN_BRANCH_CONFIG *branch_config = &layer_config->branch_config;
    const int branch = layer_config->branch;
    int o_width = 0, o_height = 0;

    if (layer_config->branch_copy_type == BRANCH_INPUT) {
      for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
        if ((branch_config->input_to_branches & (1 << b)) && b != branch) {
          assert(i_width[branch] > 0 && i_height[branch] > 0);
          i_width[b] = i_width[branch];
          i_height[b] = i_height[branch];
        }
      }
    }

    av1_find_cnn_layer_output_size(i_width[branch], i_height[branch],
                                   layer_config, &o_width, &o_height);
    i_width[branch] = o_width;
    i_height[branch] = o_height;

    if (layer_config->branch_copy_type == BRANCH_OUTPUT) {
      for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
        if ((branch_config->input_to_branches & (1 << b)) && b != branch) {
          i_width[b] = o_width;
          i_height[b] = o_height;
        }
      }
    }

    find_cnn_out_channels(layer_config, channels_per_branch);

    const int output_num = layer_config->output_num;
    if (output_num != -1) {  // Current layer is an output layer
      out_width[output_num] = o_width;
      out_height[output_num] = o_height;
      out_channels[output_num] = channels_per_branch[layer_config->branch];
    }
  }
}